

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SongListModel.cpp
# Opt level: O2

void __thiscall SongListModel::reload(SongListModel *this)

{
  int iVar1;
  Module *this_00;
  SongList *this_01;
  Song *this_02;
  string *__args;
  int index;
  
  QAbstractItemModel::beginResetModel();
  this_00 = Module::data(this->mModule);
  this_01 = trackerboy::Module::songs(this_00);
  iVar1 = trackerboy::SongList::size(this_01);
  std::vector<SongListModel::SongMeta,_std::allocator<SongListModel::SongMeta>_>::clear
            (&this->mSongData);
  index = 0;
  if (iVar1 < 1) {
    iVar1 = index;
  }
  for (; iVar1 != index; index = index + 1) {
    this_02 = trackerboy::SongList::get(this_01,index);
    __args = trackerboy::Named::name_abi_cxx11_(&this_02->super_Named);
    std::vector<SongListModel::SongMeta,std::allocator<SongListModel::SongMeta>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<SongListModel::SongMeta,std::allocator<SongListModel::SongMeta>> *)
               &this->mSongData,__args);
  }
  QAbstractItemModel::endResetModel();
  return;
}

Assistant:

void SongListModel::reload() {

    beginResetModel();

    auto const& songList = mModule.data().songs();
    auto songCount = songList.size();

    mSongData.clear();
    for (int i = 0; i < songCount; ++i) {
        mSongData.emplace_back(songList.get(i)->name());
    }


    endResetModel();

}